

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_PersonHandle.cpp
# Opt level: O2

PersonHandle * __thiscall
mbc::Val::PersonHandle::changeAttr(PersonHandle *this,string *attribute,string *value)

{
  Person *this_00;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
  *this_01;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_02;
  int iVar1;
  _ValAtom *this_03;
  Str *pSVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
  local_78;
  string local_50;
  
  if (*(this->super_ValBase).is_vaild_ == true) {
    remove(this,(char *)attribute);
    this_00 = this->person_;
    std::__cxx11::string::string((string *)&local_50,(string *)attribute);
    this_03 = Person::attr(this_00,&local_50);
    _ValAtom::set(this_03,value);
    std::__cxx11::string::~string((string *)&local_50);
    Person::update_ID_(this->person_);
    this_01 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
               *)this->mb_->persons_;
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar2);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mbc::Val::Person_*>
    ::pair<mbc::Val::Person_*&,_true>
              (&local_78,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(extraout_var,iVar1),&this->person_);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,mbc::Val::Person*>,std::_Select1st<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,mbc::Val::Person*>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,mbc::Val::Person*>>(this_01,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    this_02 = this->mb_->order_;
    pSVar2 = Person::ID(this->person_);
    iVar1 = (*(pSVar2->super__ValAtom).super_ValBase._vptr_ValBase[4])(pSVar2);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_02,(value_type *)CONCAT44(extraout_var_00,iVar1));
    *(this->super_ValBase).is_vaild_ = true;
    MessageBook::save(this->mb_);
    reset_(this);
  }
  return this;
}

Assistant:

PersonHandle& PersonHandle::changeAttr(string attribute, string value) {
    if(*is_vaild_) {
        // remove self and then update deeply
        remove();
        person_ -> attr(attribute) -> set(value);
        person_ -> update_ID_();

        // after the person's ID is changed, update mb.
        mb_ -> persons_ -> insert(std::pair<string, Person*>(person_ -> ID().raw(), person_));
        mb_ -> order_ -> push_back(person_ -> ID().raw());
        *is_vaild_ = true;

        // save messagebook and reset self
        mb_ -> save();
        reset_();
    } else {
        ; // do nothing
    }
    return *this;
}